

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O0

MessageFederate * getMessageFed(HelicsFederate fed,HelicsError *err)

{
  FedObject *pFVar1;
  element_type *peVar2;
  HelicsError *in_RSI;
  MessageFederate *rval;
  FedObject *fedObj;
  MessageFederate *local_38;
  HelicsError *in_stack_ffffffffffffffd0;
  HelicsFederate in_stack_ffffffffffffffd8;
  
  pFVar1 = helics::getFedObject(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  if (pFVar1 != (FedObject *)0x0) {
    if (((pFVar1->type == MESSAGE) || (pFVar1->type == COMBINATION)) || (pFVar1->type == CALLBACK))
    {
      peVar2 = std::__shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>::get
                         (&(pFVar1->fedptr).
                           super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>);
      if (peVar2 == (element_type *)0x0) {
        local_38 = (MessageFederate *)0x0;
      }
      else {
        local_38 = (MessageFederate *)
                   __dynamic_cast(peVar2,&helics::Federate::typeinfo,
                                  &helics::MessageFederate::typeinfo,0xffffffffffffffff);
      }
      if (local_38 != (MessageFederate *)0x0) {
        return local_38;
      }
    }
    assignError(in_RSI,-3,"Federate must be a message federate");
  }
  return (MessageFederate *)0x0;
}

Assistant:

helics::MessageFederate* getMessageFed(HelicsFederate fed, HelicsError* err)
{
    auto* fedObj = helics::getFedObject(fed, err);
    if (fedObj == nullptr) {
        return nullptr;
    }
    if ((fedObj->type == helics::FederateType::MESSAGE) || (fedObj->type == helics::FederateType::COMBINATION) ||
        (fedObj->type == helics::FederateType::CALLBACK)) {
        auto* rval = dynamic_cast<helics::MessageFederate*>(fedObj->fedptr.get());
        if (rval != nullptr) {
            return rval;
        }
    }
    assignError(err, HELICS_ERROR_INVALID_OBJECT, notMessageFedString);
    return nullptr;
}